

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_txfm_utility_sse4.h
# Opt level: O0

void transpose_16x16(__m128i *in,__m128i *out)

{
  undefined4 *in_RSI;
  undefined8 *in_RDI;
  __m128i u3_13;
  __m128i u2_13;
  __m128i u1_13;
  __m128i u0_13;
  __m128i u3_12;
  __m128i u2_12;
  __m128i u1_12;
  __m128i u0_12;
  __m128i u3_11;
  __m128i u2_11;
  __m128i u1_11;
  __m128i u0_11;
  __m128i u3_10;
  __m128i u2_10;
  __m128i u1_10;
  __m128i u0_10;
  __m128i u3_9;
  __m128i u2_9;
  __m128i u1_9;
  __m128i u0_9;
  __m128i u3_8;
  __m128i u2_8;
  __m128i u1_8;
  __m128i u0_8;
  __m128i u3_7;
  __m128i u2_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i u3_6;
  __m128i u2_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i u3_5;
  __m128i u2_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i u3_4;
  __m128i u2_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i u3_3;
  __m128i u2_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i u3_2;
  __m128i u2_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i u3_1;
  __m128i u2_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i u3;
  __m128i u2;
  __m128i u1;
  __m128i u0;
  undefined4 local_1008;
  undefined4 uStack_1004;
  undefined4 local_ff8;
  undefined4 uStack_ff4;
  undefined4 local_fe8;
  undefined4 uStack_fe4;
  undefined4 local_fd8;
  undefined4 uStack_fd4;
  undefined4 local_fc8;
  undefined4 uStack_fc4;
  undefined4 local_fb8;
  undefined4 uStack_fb4;
  undefined4 local_fa8;
  undefined4 uStack_fa4;
  undefined4 local_f98;
  undefined4 uStack_f94;
  undefined4 local_f88;
  undefined4 uStack_f84;
  undefined4 local_f78;
  undefined4 uStack_f74;
  undefined4 local_f68;
  undefined4 uStack_f64;
  undefined4 local_f58;
  undefined4 uStack_f54;
  undefined4 local_f48;
  undefined4 uStack_f44;
  undefined4 local_f38;
  undefined4 uStack_f34;
  undefined4 local_f28;
  undefined4 uStack_f24;
  undefined4 local_f18;
  undefined4 uStack_f14;
  undefined4 local_f08;
  undefined4 uStack_f04;
  undefined4 local_ef8;
  undefined4 uStack_ef4;
  undefined4 local_ee8;
  undefined4 uStack_ee4;
  undefined4 local_ed8;
  undefined4 uStack_ed4;
  undefined4 local_ec8;
  undefined4 uStack_ec4;
  undefined4 local_eb8;
  undefined4 uStack_eb4;
  undefined4 local_ea8;
  undefined4 uStack_ea4;
  undefined4 local_e98;
  undefined4 uStack_e94;
  undefined4 local_e88;
  undefined4 uStack_e84;
  undefined4 local_e78;
  undefined4 uStack_e74;
  undefined4 local_e68;
  undefined4 uStack_e64;
  undefined4 local_e58;
  undefined4 uStack_e54;
  undefined4 local_e48;
  undefined4 uStack_e44;
  undefined4 local_e38;
  undefined4 uStack_e34;
  undefined4 local_e28;
  undefined4 uStack_e24;
  undefined4 local_e18;
  undefined4 uStack_e14;
  undefined4 local_e08;
  undefined4 uStack_e04;
  undefined4 local_df8;
  undefined4 uStack_df4;
  undefined4 local_de8;
  undefined4 uStack_de4;
  undefined4 local_dd8;
  undefined4 uStack_dd4;
  undefined4 local_dc8;
  undefined4 uStack_dc4;
  undefined4 local_db8;
  undefined4 uStack_db4;
  undefined4 local_da8;
  undefined4 uStack_da4;
  undefined4 local_d98;
  undefined4 uStack_d94;
  undefined4 local_d88;
  undefined4 uStack_d84;
  undefined4 local_d78;
  undefined4 uStack_d74;
  undefined4 local_d68;
  undefined4 uStack_d64;
  undefined4 local_d58;
  undefined4 uStack_d54;
  undefined4 local_d48;
  undefined4 uStack_d44;
  undefined4 local_d38;
  undefined4 uStack_d34;
  undefined4 local_d28;
  undefined4 uStack_d24;
  undefined4 local_d18;
  undefined4 uStack_d14;
  undefined4 local_d08;
  undefined4 uStack_d04;
  undefined4 local_cf8;
  undefined4 uStack_cf4;
  undefined4 local_ce8;
  undefined4 uStack_ce4;
  undefined4 local_cd8;
  undefined4 uStack_cd4;
  undefined4 local_cc8;
  undefined4 uStack_cc4;
  undefined4 local_cb8;
  undefined4 uStack_cb4;
  undefined4 local_ca8;
  undefined4 uStack_ca4;
  undefined4 local_c98;
  undefined4 uStack_c94;
  undefined4 local_c88;
  undefined4 uStack_c84;
  undefined4 local_c78;
  undefined4 uStack_c74;
  undefined4 local_c68;
  undefined4 uStack_c64;
  undefined4 local_c58;
  undefined4 uStack_c54;
  undefined4 local_c48;
  undefined4 uStack_c44;
  undefined4 local_c38;
  undefined4 uStack_c34;
  undefined4 local_c28;
  undefined4 uStack_c24;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c00;
  undefined4 uStack_bfc;
  undefined4 uStack_bf0;
  undefined4 uStack_bec;
  undefined4 uStack_be0;
  undefined4 uStack_bdc;
  undefined4 uStack_bd0;
  undefined4 uStack_bcc;
  undefined4 uStack_bc0;
  undefined4 uStack_bbc;
  undefined4 uStack_bb0;
  undefined4 uStack_bac;
  undefined4 uStack_ba0;
  undefined4 uStack_b9c;
  undefined4 uStack_b90;
  undefined4 uStack_b8c;
  undefined4 uStack_b80;
  undefined4 uStack_b7c;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b60;
  undefined4 uStack_b5c;
  undefined4 uStack_b50;
  undefined4 uStack_b4c;
  undefined4 uStack_b40;
  undefined4 uStack_b3c;
  undefined4 uStack_b30;
  undefined4 uStack_b2c;
  undefined4 uStack_b20;
  undefined4 uStack_b1c;
  undefined4 uStack_b10;
  undefined4 uStack_b0c;
  undefined4 uStack_b00;
  undefined4 uStack_afc;
  undefined4 uStack_af0;
  undefined4 uStack_aec;
  undefined4 uStack_ae0;
  undefined4 uStack_adc;
  undefined4 uStack_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 uStack_aa0;
  undefined4 uStack_a9c;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 uStack_a80;
  undefined4 uStack_a7c;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 uStack_a60;
  undefined4 uStack_a5c;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined4 uStack_a40;
  undefined4 uStack_a3c;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  undefined4 uStack_a20;
  undefined4 uStack_a1c;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 uStack_a00;
  undefined4 uStack_9fc;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 uStack_9e0;
  undefined4 uStack_9dc;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 uStack_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a0;
  undefined4 uStack_99c;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 uStack_980;
  undefined4 uStack_97c;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 uStack_960;
  undefined4 uStack_95c;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 uStack_940;
  undefined4 uStack_93c;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 uStack_920;
  undefined4 uStack_91c;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 uStack_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_880;
  undefined4 uStack_87c;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 uStack_860;
  undefined4 uStack_85c;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 uStack_840;
  undefined4 uStack_83c;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 uStack_820;
  undefined4 uStack_81c;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  __m128i u3_15;
  __m128i u2_15;
  __m128i u1_15;
  __m128i u0_15;
  __m128i u3_14;
  __m128i u2_14;
  __m128i u1_14;
  __m128i u0_14;
  
  local_c18 = (undefined4)*in_RDI;
  uStack_c14 = (undefined4)((ulong)*in_RDI >> 0x20);
  local_c28 = (undefined4)in_RDI[8];
  uStack_c24 = (undefined4)((ulong)in_RDI[8] >> 0x20);
  uStack_810 = (undefined4)in_RDI[1];
  uStack_80c = (undefined4)((ulong)in_RDI[1] >> 0x20);
  uStack_820 = (undefined4)in_RDI[9];
  uStack_81c = (undefined4)((ulong)in_RDI[9] >> 0x20);
  local_c38 = (undefined4)in_RDI[0x10];
  uStack_c34 = (undefined4)((ulong)in_RDI[0x10] >> 0x20);
  local_c48 = (undefined4)in_RDI[0x18];
  uStack_c44 = (undefined4)((ulong)in_RDI[0x18] >> 0x20);
  uStack_830 = (undefined4)in_RDI[0x11];
  uStack_82c = (undefined4)((ulong)in_RDI[0x11] >> 0x20);
  uStack_840 = (undefined4)in_RDI[0x19];
  uStack_83c = (undefined4)((ulong)in_RDI[0x19] >> 0x20);
  *in_RSI = local_c18;
  in_RSI[1] = local_c28;
  in_RSI[2] = local_c38;
  in_RSI[3] = local_c48;
  in_RSI[0x10] = uStack_c14;
  in_RSI[0x11] = uStack_c24;
  in_RSI[0x12] = uStack_c34;
  in_RSI[0x13] = uStack_c44;
  in_RSI[0x20] = uStack_810;
  in_RSI[0x21] = uStack_820;
  in_RSI[0x22] = uStack_830;
  in_RSI[0x23] = uStack_840;
  in_RSI[0x30] = uStack_80c;
  in_RSI[0x31] = uStack_81c;
  in_RSI[0x32] = uStack_82c;
  in_RSI[0x33] = uStack_83c;
  local_c58 = (undefined4)in_RDI[2];
  uStack_c54 = (undefined4)((ulong)in_RDI[2] >> 0x20);
  local_c68 = (undefined4)in_RDI[10];
  uStack_c64 = (undefined4)((ulong)in_RDI[10] >> 0x20);
  uStack_850 = (undefined4)in_RDI[3];
  uStack_84c = (undefined4)((ulong)in_RDI[3] >> 0x20);
  uStack_860 = (undefined4)in_RDI[0xb];
  uStack_85c = (undefined4)((ulong)in_RDI[0xb] >> 0x20);
  local_c78 = (undefined4)in_RDI[0x12];
  uStack_c74 = (undefined4)((ulong)in_RDI[0x12] >> 0x20);
  local_c88 = (undefined4)in_RDI[0x1a];
  uStack_c84 = (undefined4)((ulong)in_RDI[0x1a] >> 0x20);
  uStack_870 = (undefined4)in_RDI[0x13];
  uStack_86c = (undefined4)((ulong)in_RDI[0x13] >> 0x20);
  uStack_880 = (undefined4)in_RDI[0x1b];
  uStack_87c = (undefined4)((ulong)in_RDI[0x1b] >> 0x20);
  in_RSI[0x40] = local_c58;
  in_RSI[0x41] = local_c68;
  in_RSI[0x42] = local_c78;
  in_RSI[0x43] = local_c88;
  in_RSI[0x50] = uStack_c54;
  in_RSI[0x51] = uStack_c64;
  in_RSI[0x52] = uStack_c74;
  in_RSI[0x53] = uStack_c84;
  in_RSI[0x60] = uStack_850;
  in_RSI[0x61] = uStack_860;
  in_RSI[0x62] = uStack_870;
  in_RSI[99] = uStack_880;
  in_RSI[0x70] = uStack_84c;
  in_RSI[0x71] = uStack_85c;
  in_RSI[0x72] = uStack_86c;
  in_RSI[0x73] = uStack_87c;
  local_c98 = (undefined4)in_RDI[0x20];
  uStack_c94 = (undefined4)((ulong)in_RDI[0x20] >> 0x20);
  local_ca8 = (undefined4)in_RDI[0x28];
  uStack_ca4 = (undefined4)((ulong)in_RDI[0x28] >> 0x20);
  uStack_890 = (undefined4)in_RDI[0x21];
  uStack_88c = (undefined4)((ulong)in_RDI[0x21] >> 0x20);
  uStack_8a0 = (undefined4)in_RDI[0x29];
  uStack_89c = (undefined4)((ulong)in_RDI[0x29] >> 0x20);
  local_cb8 = (undefined4)in_RDI[0x30];
  uStack_cb4 = (undefined4)((ulong)in_RDI[0x30] >> 0x20);
  local_cc8 = (undefined4)in_RDI[0x38];
  uStack_cc4 = (undefined4)((ulong)in_RDI[0x38] >> 0x20);
  uStack_8b0 = (undefined4)in_RDI[0x31];
  uStack_8ac = (undefined4)((ulong)in_RDI[0x31] >> 0x20);
  uStack_8c0 = (undefined4)in_RDI[0x39];
  uStack_8bc = (undefined4)((ulong)in_RDI[0x39] >> 0x20);
  in_RSI[4] = local_c98;
  in_RSI[5] = local_ca8;
  in_RSI[6] = local_cb8;
  in_RSI[7] = local_cc8;
  in_RSI[0x14] = uStack_c94;
  in_RSI[0x15] = uStack_ca4;
  in_RSI[0x16] = uStack_cb4;
  in_RSI[0x17] = uStack_cc4;
  in_RSI[0x24] = uStack_890;
  in_RSI[0x25] = uStack_8a0;
  in_RSI[0x26] = uStack_8b0;
  in_RSI[0x27] = uStack_8c0;
  in_RSI[0x34] = uStack_88c;
  in_RSI[0x35] = uStack_89c;
  in_RSI[0x36] = uStack_8ac;
  in_RSI[0x37] = uStack_8bc;
  local_cd8 = (undefined4)in_RDI[0x22];
  uStack_cd4 = (undefined4)((ulong)in_RDI[0x22] >> 0x20);
  local_ce8 = (undefined4)in_RDI[0x2a];
  uStack_ce4 = (undefined4)((ulong)in_RDI[0x2a] >> 0x20);
  uStack_8d0 = (undefined4)in_RDI[0x23];
  uStack_8cc = (undefined4)((ulong)in_RDI[0x23] >> 0x20);
  uStack_8e0 = (undefined4)in_RDI[0x2b];
  uStack_8dc = (undefined4)((ulong)in_RDI[0x2b] >> 0x20);
  local_cf8 = (undefined4)in_RDI[0x32];
  uStack_cf4 = (undefined4)((ulong)in_RDI[0x32] >> 0x20);
  local_d08 = (undefined4)in_RDI[0x3a];
  uStack_d04 = (undefined4)((ulong)in_RDI[0x3a] >> 0x20);
  uStack_8f0 = (undefined4)in_RDI[0x33];
  uStack_8ec = (undefined4)((ulong)in_RDI[0x33] >> 0x20);
  uStack_900 = (undefined4)in_RDI[0x3b];
  uStack_8fc = (undefined4)((ulong)in_RDI[0x3b] >> 0x20);
  in_RSI[0x44] = local_cd8;
  in_RSI[0x45] = local_ce8;
  in_RSI[0x46] = local_cf8;
  in_RSI[0x47] = local_d08;
  in_RSI[0x54] = uStack_cd4;
  in_RSI[0x55] = uStack_ce4;
  in_RSI[0x56] = uStack_cf4;
  in_RSI[0x57] = uStack_d04;
  in_RSI[100] = uStack_8d0;
  in_RSI[0x65] = uStack_8e0;
  in_RSI[0x66] = uStack_8f0;
  in_RSI[0x67] = uStack_900;
  in_RSI[0x74] = uStack_8cc;
  in_RSI[0x75] = uStack_8dc;
  in_RSI[0x76] = uStack_8ec;
  in_RSI[0x77] = uStack_8fc;
  local_d18 = (undefined4)in_RDI[4];
  uStack_d14 = (undefined4)((ulong)in_RDI[4] >> 0x20);
  local_d28 = (undefined4)in_RDI[0xc];
  uStack_d24 = (undefined4)((ulong)in_RDI[0xc] >> 0x20);
  uStack_910 = (undefined4)in_RDI[5];
  uStack_90c = (undefined4)((ulong)in_RDI[5] >> 0x20);
  uStack_920 = (undefined4)in_RDI[0xd];
  uStack_91c = (undefined4)((ulong)in_RDI[0xd] >> 0x20);
  local_d38 = (undefined4)in_RDI[0x14];
  uStack_d34 = (undefined4)((ulong)in_RDI[0x14] >> 0x20);
  local_d48 = (undefined4)in_RDI[0x1c];
  uStack_d44 = (undefined4)((ulong)in_RDI[0x1c] >> 0x20);
  uStack_930 = (undefined4)in_RDI[0x15];
  uStack_92c = (undefined4)((ulong)in_RDI[0x15] >> 0x20);
  uStack_940 = (undefined4)in_RDI[0x1d];
  uStack_93c = (undefined4)((ulong)in_RDI[0x1d] >> 0x20);
  in_RSI[0x80] = local_d18;
  in_RSI[0x81] = local_d28;
  in_RSI[0x82] = local_d38;
  in_RSI[0x83] = local_d48;
  in_RSI[0x90] = uStack_d14;
  in_RSI[0x91] = uStack_d24;
  in_RSI[0x92] = uStack_d34;
  in_RSI[0x93] = uStack_d44;
  in_RSI[0xa0] = uStack_910;
  in_RSI[0xa1] = uStack_920;
  in_RSI[0xa2] = uStack_930;
  in_RSI[0xa3] = uStack_940;
  in_RSI[0xb0] = uStack_90c;
  in_RSI[0xb1] = uStack_91c;
  in_RSI[0xb2] = uStack_92c;
  in_RSI[0xb3] = uStack_93c;
  local_d58 = (undefined4)in_RDI[6];
  uStack_d54 = (undefined4)((ulong)in_RDI[6] >> 0x20);
  local_d68 = (undefined4)in_RDI[0xe];
  uStack_d64 = (undefined4)((ulong)in_RDI[0xe] >> 0x20);
  uStack_950 = (undefined4)in_RDI[7];
  uStack_94c = (undefined4)((ulong)in_RDI[7] >> 0x20);
  uStack_960 = (undefined4)in_RDI[0xf];
  uStack_95c = (undefined4)((ulong)in_RDI[0xf] >> 0x20);
  local_d78 = (undefined4)in_RDI[0x16];
  uStack_d74 = (undefined4)((ulong)in_RDI[0x16] >> 0x20);
  local_d88 = (undefined4)in_RDI[0x1e];
  uStack_d84 = (undefined4)((ulong)in_RDI[0x1e] >> 0x20);
  uStack_970 = (undefined4)in_RDI[0x17];
  uStack_96c = (undefined4)((ulong)in_RDI[0x17] >> 0x20);
  uStack_980 = (undefined4)in_RDI[0x1f];
  uStack_97c = (undefined4)((ulong)in_RDI[0x1f] >> 0x20);
  in_RSI[0xc0] = local_d58;
  in_RSI[0xc1] = local_d68;
  in_RSI[0xc2] = local_d78;
  in_RSI[0xc3] = local_d88;
  in_RSI[0xd0] = uStack_d54;
  in_RSI[0xd1] = uStack_d64;
  in_RSI[0xd2] = uStack_d74;
  in_RSI[0xd3] = uStack_d84;
  in_RSI[0xe0] = uStack_950;
  in_RSI[0xe1] = uStack_960;
  in_RSI[0xe2] = uStack_970;
  in_RSI[0xe3] = uStack_980;
  in_RSI[0xf0] = uStack_94c;
  in_RSI[0xf1] = uStack_95c;
  in_RSI[0xf2] = uStack_96c;
  in_RSI[0xf3] = uStack_97c;
  local_d98 = (undefined4)in_RDI[0x24];
  uStack_d94 = (undefined4)((ulong)in_RDI[0x24] >> 0x20);
  local_da8 = (undefined4)in_RDI[0x2c];
  uStack_da4 = (undefined4)((ulong)in_RDI[0x2c] >> 0x20);
  uStack_990 = (undefined4)in_RDI[0x25];
  uStack_98c = (undefined4)((ulong)in_RDI[0x25] >> 0x20);
  uStack_9a0 = (undefined4)in_RDI[0x2d];
  uStack_99c = (undefined4)((ulong)in_RDI[0x2d] >> 0x20);
  local_db8 = (undefined4)in_RDI[0x34];
  uStack_db4 = (undefined4)((ulong)in_RDI[0x34] >> 0x20);
  local_dc8 = (undefined4)in_RDI[0x3c];
  uStack_dc4 = (undefined4)((ulong)in_RDI[0x3c] >> 0x20);
  uStack_9b0 = (undefined4)in_RDI[0x35];
  uStack_9ac = (undefined4)((ulong)in_RDI[0x35] >> 0x20);
  uStack_9c0 = (undefined4)in_RDI[0x3d];
  uStack_9bc = (undefined4)((ulong)in_RDI[0x3d] >> 0x20);
  in_RSI[0x84] = local_d98;
  in_RSI[0x85] = local_da8;
  in_RSI[0x86] = local_db8;
  in_RSI[0x87] = local_dc8;
  in_RSI[0x94] = uStack_d94;
  in_RSI[0x95] = uStack_da4;
  in_RSI[0x96] = uStack_db4;
  in_RSI[0x97] = uStack_dc4;
  in_RSI[0xa4] = uStack_990;
  in_RSI[0xa5] = uStack_9a0;
  in_RSI[0xa6] = uStack_9b0;
  in_RSI[0xa7] = uStack_9c0;
  in_RSI[0xb4] = uStack_98c;
  in_RSI[0xb5] = uStack_99c;
  in_RSI[0xb6] = uStack_9ac;
  in_RSI[0xb7] = uStack_9bc;
  local_dd8 = (undefined4)in_RDI[0x26];
  uStack_dd4 = (undefined4)((ulong)in_RDI[0x26] >> 0x20);
  local_de8 = (undefined4)in_RDI[0x2e];
  uStack_de4 = (undefined4)((ulong)in_RDI[0x2e] >> 0x20);
  uStack_9d0 = (undefined4)in_RDI[0x27];
  uStack_9cc = (undefined4)((ulong)in_RDI[0x27] >> 0x20);
  uStack_9e0 = (undefined4)in_RDI[0x2f];
  uStack_9dc = (undefined4)((ulong)in_RDI[0x2f] >> 0x20);
  local_df8 = (undefined4)in_RDI[0x36];
  uStack_df4 = (undefined4)((ulong)in_RDI[0x36] >> 0x20);
  local_e08 = (undefined4)in_RDI[0x3e];
  uStack_e04 = (undefined4)((ulong)in_RDI[0x3e] >> 0x20);
  uStack_9f0 = (undefined4)in_RDI[0x37];
  uStack_9ec = (undefined4)((ulong)in_RDI[0x37] >> 0x20);
  uStack_a00 = (undefined4)in_RDI[0x3f];
  uStack_9fc = (undefined4)((ulong)in_RDI[0x3f] >> 0x20);
  in_RSI[0xc4] = local_dd8;
  in_RSI[0xc5] = local_de8;
  in_RSI[0xc6] = local_df8;
  in_RSI[199] = local_e08;
  in_RSI[0xd4] = uStack_dd4;
  in_RSI[0xd5] = uStack_de4;
  in_RSI[0xd6] = uStack_df4;
  in_RSI[0xd7] = uStack_e04;
  in_RSI[0xe4] = uStack_9d0;
  in_RSI[0xe5] = uStack_9e0;
  in_RSI[0xe6] = uStack_9f0;
  in_RSI[0xe7] = uStack_a00;
  in_RSI[0xf4] = uStack_9cc;
  in_RSI[0xf5] = uStack_9dc;
  in_RSI[0xf6] = uStack_9ec;
  in_RSI[0xf7] = uStack_9fc;
  local_e18 = (undefined4)in_RDI[0x40];
  uStack_e14 = (undefined4)((ulong)in_RDI[0x40] >> 0x20);
  local_e28 = (undefined4)in_RDI[0x48];
  uStack_e24 = (undefined4)((ulong)in_RDI[0x48] >> 0x20);
  uStack_a10 = (undefined4)in_RDI[0x41];
  uStack_a0c = (undefined4)((ulong)in_RDI[0x41] >> 0x20);
  uStack_a20 = (undefined4)in_RDI[0x49];
  uStack_a1c = (undefined4)((ulong)in_RDI[0x49] >> 0x20);
  local_e38 = (undefined4)in_RDI[0x50];
  uStack_e34 = (undefined4)((ulong)in_RDI[0x50] >> 0x20);
  local_e48 = (undefined4)in_RDI[0x58];
  uStack_e44 = (undefined4)((ulong)in_RDI[0x58] >> 0x20);
  uStack_a30 = (undefined4)in_RDI[0x51];
  uStack_a2c = (undefined4)((ulong)in_RDI[0x51] >> 0x20);
  uStack_a40 = (undefined4)in_RDI[0x59];
  uStack_a3c = (undefined4)((ulong)in_RDI[0x59] >> 0x20);
  in_RSI[8] = local_e18;
  in_RSI[9] = local_e28;
  in_RSI[10] = local_e38;
  in_RSI[0xb] = local_e48;
  in_RSI[0x18] = uStack_e14;
  in_RSI[0x19] = uStack_e24;
  in_RSI[0x1a] = uStack_e34;
  in_RSI[0x1b] = uStack_e44;
  in_RSI[0x28] = uStack_a10;
  in_RSI[0x29] = uStack_a20;
  in_RSI[0x2a] = uStack_a30;
  in_RSI[0x2b] = uStack_a40;
  in_RSI[0x38] = uStack_a0c;
  in_RSI[0x39] = uStack_a1c;
  in_RSI[0x3a] = uStack_a2c;
  in_RSI[0x3b] = uStack_a3c;
  local_e58 = (undefined4)in_RDI[0x42];
  uStack_e54 = (undefined4)((ulong)in_RDI[0x42] >> 0x20);
  local_e68 = (undefined4)in_RDI[0x4a];
  uStack_e64 = (undefined4)((ulong)in_RDI[0x4a] >> 0x20);
  uStack_a50 = (undefined4)in_RDI[0x43];
  uStack_a4c = (undefined4)((ulong)in_RDI[0x43] >> 0x20);
  uStack_a60 = (undefined4)in_RDI[0x4b];
  uStack_a5c = (undefined4)((ulong)in_RDI[0x4b] >> 0x20);
  local_e78 = (undefined4)in_RDI[0x52];
  uStack_e74 = (undefined4)((ulong)in_RDI[0x52] >> 0x20);
  local_e88 = (undefined4)in_RDI[0x5a];
  uStack_e84 = (undefined4)((ulong)in_RDI[0x5a] >> 0x20);
  uStack_a70 = (undefined4)in_RDI[0x53];
  uStack_a6c = (undefined4)((ulong)in_RDI[0x53] >> 0x20);
  uStack_a80 = (undefined4)in_RDI[0x5b];
  uStack_a7c = (undefined4)((ulong)in_RDI[0x5b] >> 0x20);
  in_RSI[0x48] = local_e58;
  in_RSI[0x49] = local_e68;
  in_RSI[0x4a] = local_e78;
  in_RSI[0x4b] = local_e88;
  in_RSI[0x58] = uStack_e54;
  in_RSI[0x59] = uStack_e64;
  in_RSI[0x5a] = uStack_e74;
  in_RSI[0x5b] = uStack_e84;
  in_RSI[0x68] = uStack_a50;
  in_RSI[0x69] = uStack_a60;
  in_RSI[0x6a] = uStack_a70;
  in_RSI[0x6b] = uStack_a80;
  in_RSI[0x78] = uStack_a4c;
  in_RSI[0x79] = uStack_a5c;
  in_RSI[0x7a] = uStack_a6c;
  in_RSI[0x7b] = uStack_a7c;
  local_e98 = (undefined4)in_RDI[0x60];
  uStack_e94 = (undefined4)((ulong)in_RDI[0x60] >> 0x20);
  local_ea8 = (undefined4)in_RDI[0x68];
  uStack_ea4 = (undefined4)((ulong)in_RDI[0x68] >> 0x20);
  uStack_a90 = (undefined4)in_RDI[0x61];
  uStack_a8c = (undefined4)((ulong)in_RDI[0x61] >> 0x20);
  uStack_aa0 = (undefined4)in_RDI[0x69];
  uStack_a9c = (undefined4)((ulong)in_RDI[0x69] >> 0x20);
  local_eb8 = (undefined4)in_RDI[0x70];
  uStack_eb4 = (undefined4)((ulong)in_RDI[0x70] >> 0x20);
  local_ec8 = (undefined4)in_RDI[0x78];
  uStack_ec4 = (undefined4)((ulong)in_RDI[0x78] >> 0x20);
  uStack_ab0 = (undefined4)in_RDI[0x71];
  uStack_aac = (undefined4)((ulong)in_RDI[0x71] >> 0x20);
  uStack_ac0 = (undefined4)in_RDI[0x79];
  uStack_abc = (undefined4)((ulong)in_RDI[0x79] >> 0x20);
  in_RSI[0xc] = local_e98;
  in_RSI[0xd] = local_ea8;
  in_RSI[0xe] = local_eb8;
  in_RSI[0xf] = local_ec8;
  in_RSI[0x1c] = uStack_e94;
  in_RSI[0x1d] = uStack_ea4;
  in_RSI[0x1e] = uStack_eb4;
  in_RSI[0x1f] = uStack_ec4;
  in_RSI[0x2c] = uStack_a90;
  in_RSI[0x2d] = uStack_aa0;
  in_RSI[0x2e] = uStack_ab0;
  in_RSI[0x2f] = uStack_ac0;
  in_RSI[0x3c] = uStack_a8c;
  in_RSI[0x3d] = uStack_a9c;
  in_RSI[0x3e] = uStack_aac;
  in_RSI[0x3f] = uStack_abc;
  local_ed8 = (undefined4)in_RDI[0x62];
  uStack_ed4 = (undefined4)((ulong)in_RDI[0x62] >> 0x20);
  local_ee8 = (undefined4)in_RDI[0x6a];
  uStack_ee4 = (undefined4)((ulong)in_RDI[0x6a] >> 0x20);
  uStack_ad0 = (undefined4)in_RDI[99];
  uStack_acc = (undefined4)((ulong)in_RDI[99] >> 0x20);
  uStack_ae0 = (undefined4)in_RDI[0x6b];
  uStack_adc = (undefined4)((ulong)in_RDI[0x6b] >> 0x20);
  local_ef8 = (undefined4)in_RDI[0x72];
  uStack_ef4 = (undefined4)((ulong)in_RDI[0x72] >> 0x20);
  local_f08 = (undefined4)in_RDI[0x7a];
  uStack_f04 = (undefined4)((ulong)in_RDI[0x7a] >> 0x20);
  uStack_af0 = (undefined4)in_RDI[0x73];
  uStack_aec = (undefined4)((ulong)in_RDI[0x73] >> 0x20);
  uStack_b00 = (undefined4)in_RDI[0x7b];
  uStack_afc = (undefined4)((ulong)in_RDI[0x7b] >> 0x20);
  in_RSI[0x4c] = local_ed8;
  in_RSI[0x4d] = local_ee8;
  in_RSI[0x4e] = local_ef8;
  in_RSI[0x4f] = local_f08;
  in_RSI[0x5c] = uStack_ed4;
  in_RSI[0x5d] = uStack_ee4;
  in_RSI[0x5e] = uStack_ef4;
  in_RSI[0x5f] = uStack_f04;
  in_RSI[0x6c] = uStack_ad0;
  in_RSI[0x6d] = uStack_ae0;
  in_RSI[0x6e] = uStack_af0;
  in_RSI[0x6f] = uStack_b00;
  in_RSI[0x7c] = uStack_acc;
  in_RSI[0x7d] = uStack_adc;
  in_RSI[0x7e] = uStack_aec;
  in_RSI[0x7f] = uStack_afc;
  local_f18 = (undefined4)in_RDI[0x44];
  uStack_f14 = (undefined4)((ulong)in_RDI[0x44] >> 0x20);
  local_f28 = (undefined4)in_RDI[0x4c];
  uStack_f24 = (undefined4)((ulong)in_RDI[0x4c] >> 0x20);
  uStack_b10 = (undefined4)in_RDI[0x45];
  uStack_b0c = (undefined4)((ulong)in_RDI[0x45] >> 0x20);
  uStack_b20 = (undefined4)in_RDI[0x4d];
  uStack_b1c = (undefined4)((ulong)in_RDI[0x4d] >> 0x20);
  local_f38 = (undefined4)in_RDI[0x54];
  uStack_f34 = (undefined4)((ulong)in_RDI[0x54] >> 0x20);
  local_f48 = (undefined4)in_RDI[0x5c];
  uStack_f44 = (undefined4)((ulong)in_RDI[0x5c] >> 0x20);
  uStack_b30 = (undefined4)in_RDI[0x55];
  uStack_b2c = (undefined4)((ulong)in_RDI[0x55] >> 0x20);
  uStack_b40 = (undefined4)in_RDI[0x5d];
  uStack_b3c = (undefined4)((ulong)in_RDI[0x5d] >> 0x20);
  in_RSI[0x88] = local_f18;
  in_RSI[0x89] = local_f28;
  in_RSI[0x8a] = local_f38;
  in_RSI[0x8b] = local_f48;
  in_RSI[0x98] = uStack_f14;
  in_RSI[0x99] = uStack_f24;
  in_RSI[0x9a] = uStack_f34;
  in_RSI[0x9b] = uStack_f44;
  in_RSI[0xa8] = uStack_b10;
  in_RSI[0xa9] = uStack_b20;
  in_RSI[0xaa] = uStack_b30;
  in_RSI[0xab] = uStack_b40;
  in_RSI[0xb8] = uStack_b0c;
  in_RSI[0xb9] = uStack_b1c;
  in_RSI[0xba] = uStack_b2c;
  in_RSI[0xbb] = uStack_b3c;
  local_f58 = (undefined4)in_RDI[0x46];
  uStack_f54 = (undefined4)((ulong)in_RDI[0x46] >> 0x20);
  local_f68 = (undefined4)in_RDI[0x4e];
  uStack_f64 = (undefined4)((ulong)in_RDI[0x4e] >> 0x20);
  uStack_b50 = (undefined4)in_RDI[0x47];
  uStack_b4c = (undefined4)((ulong)in_RDI[0x47] >> 0x20);
  uStack_b60 = (undefined4)in_RDI[0x4f];
  uStack_b5c = (undefined4)((ulong)in_RDI[0x4f] >> 0x20);
  local_f78 = (undefined4)in_RDI[0x56];
  uStack_f74 = (undefined4)((ulong)in_RDI[0x56] >> 0x20);
  local_f88 = (undefined4)in_RDI[0x5e];
  uStack_f84 = (undefined4)((ulong)in_RDI[0x5e] >> 0x20);
  uStack_b70 = (undefined4)in_RDI[0x57];
  uStack_b6c = (undefined4)((ulong)in_RDI[0x57] >> 0x20);
  uStack_b80 = (undefined4)in_RDI[0x5f];
  uStack_b7c = (undefined4)((ulong)in_RDI[0x5f] >> 0x20);
  in_RSI[200] = local_f58;
  in_RSI[0xc9] = local_f68;
  in_RSI[0xca] = local_f78;
  in_RSI[0xcb] = local_f88;
  in_RSI[0xd8] = uStack_f54;
  in_RSI[0xd9] = uStack_f64;
  in_RSI[0xda] = uStack_f74;
  in_RSI[0xdb] = uStack_f84;
  in_RSI[0xe8] = uStack_b50;
  in_RSI[0xe9] = uStack_b60;
  in_RSI[0xea] = uStack_b70;
  in_RSI[0xeb] = uStack_b80;
  in_RSI[0xf8] = uStack_b4c;
  in_RSI[0xf9] = uStack_b5c;
  in_RSI[0xfa] = uStack_b6c;
  in_RSI[0xfb] = uStack_b7c;
  local_f98 = (undefined4)in_RDI[100];
  uStack_f94 = (undefined4)((ulong)in_RDI[100] >> 0x20);
  local_fa8 = (undefined4)in_RDI[0x6c];
  uStack_fa4 = (undefined4)((ulong)in_RDI[0x6c] >> 0x20);
  uStack_b90 = (undefined4)in_RDI[0x65];
  uStack_b8c = (undefined4)((ulong)in_RDI[0x65] >> 0x20);
  uStack_ba0 = (undefined4)in_RDI[0x6d];
  uStack_b9c = (undefined4)((ulong)in_RDI[0x6d] >> 0x20);
  local_fb8 = (undefined4)in_RDI[0x74];
  uStack_fb4 = (undefined4)((ulong)in_RDI[0x74] >> 0x20);
  local_fc8 = (undefined4)in_RDI[0x7c];
  uStack_fc4 = (undefined4)((ulong)in_RDI[0x7c] >> 0x20);
  uStack_bb0 = (undefined4)in_RDI[0x75];
  uStack_bac = (undefined4)((ulong)in_RDI[0x75] >> 0x20);
  uStack_bc0 = (undefined4)in_RDI[0x7d];
  uStack_bbc = (undefined4)((ulong)in_RDI[0x7d] >> 0x20);
  in_RSI[0x8c] = local_f98;
  in_RSI[0x8d] = local_fa8;
  in_RSI[0x8e] = local_fb8;
  in_RSI[0x8f] = local_fc8;
  in_RSI[0x9c] = uStack_f94;
  in_RSI[0x9d] = uStack_fa4;
  in_RSI[0x9e] = uStack_fb4;
  in_RSI[0x9f] = uStack_fc4;
  in_RSI[0xac] = uStack_b90;
  in_RSI[0xad] = uStack_ba0;
  in_RSI[0xae] = uStack_bb0;
  in_RSI[0xaf] = uStack_bc0;
  in_RSI[0xbc] = uStack_b8c;
  in_RSI[0xbd] = uStack_b9c;
  in_RSI[0xbe] = uStack_bac;
  in_RSI[0xbf] = uStack_bbc;
  local_fd8 = (undefined4)in_RDI[0x66];
  uStack_fd4 = (undefined4)((ulong)in_RDI[0x66] >> 0x20);
  local_fe8 = (undefined4)in_RDI[0x6e];
  uStack_fe4 = (undefined4)((ulong)in_RDI[0x6e] >> 0x20);
  uStack_bd0 = (undefined4)in_RDI[0x67];
  uStack_bcc = (undefined4)((ulong)in_RDI[0x67] >> 0x20);
  uStack_be0 = (undefined4)in_RDI[0x6f];
  uStack_bdc = (undefined4)((ulong)in_RDI[0x6f] >> 0x20);
  local_ff8 = (undefined4)in_RDI[0x76];
  uStack_ff4 = (undefined4)((ulong)in_RDI[0x76] >> 0x20);
  local_1008 = (undefined4)in_RDI[0x7e];
  uStack_1004 = (undefined4)((ulong)in_RDI[0x7e] >> 0x20);
  uStack_bf0 = (undefined4)in_RDI[0x77];
  uStack_bec = (undefined4)((ulong)in_RDI[0x77] >> 0x20);
  uStack_c00 = (undefined4)in_RDI[0x7f];
  uStack_bfc = (undefined4)((ulong)in_RDI[0x7f] >> 0x20);
  in_RSI[0xcc] = local_fd8;
  in_RSI[0xcd] = local_fe8;
  in_RSI[0xce] = local_ff8;
  in_RSI[0xcf] = local_1008;
  in_RSI[0xdc] = uStack_fd4;
  in_RSI[0xdd] = uStack_fe4;
  in_RSI[0xde] = uStack_ff4;
  in_RSI[0xdf] = uStack_1004;
  in_RSI[0xec] = uStack_bd0;
  in_RSI[0xed] = uStack_be0;
  in_RSI[0xee] = uStack_bf0;
  in_RSI[0xef] = uStack_c00;
  in_RSI[0xfc] = uStack_bcc;
  in_RSI[0xfd] = uStack_bdc;
  in_RSI[0xfe] = uStack_bec;
  in_RSI[0xff] = uStack_bfc;
  return;
}

Assistant:

static inline void transpose_16x16(const __m128i *in, __m128i *out) {
  // Upper left 8x8
  TRANSPOSE_4X4(in[0], in[4], in[8], in[12], out[0], out[4], out[8], out[12]);
  TRANSPOSE_4X4(in[1], in[5], in[9], in[13], out[16], out[20], out[24],
                out[28]);
  TRANSPOSE_4X4(in[16], in[20], in[24], in[28], out[1], out[5], out[9],
                out[13]);
  TRANSPOSE_4X4(in[17], in[21], in[25], in[29], out[17], out[21], out[25],
                out[29]);

  // Upper right 8x8
  TRANSPOSE_4X4(in[2], in[6], in[10], in[14], out[32], out[36], out[40],
                out[44]);
  TRANSPOSE_4X4(in[3], in[7], in[11], in[15], out[48], out[52], out[56],
                out[60]);
  TRANSPOSE_4X4(in[18], in[22], in[26], in[30], out[33], out[37], out[41],
                out[45]);
  TRANSPOSE_4X4(in[19], in[23], in[27], in[31], out[49], out[53], out[57],
                out[61]);

  // Lower left 8x8
  TRANSPOSE_4X4(in[32], in[36], in[40], in[44], out[2], out[6], out[10],
                out[14]);
  TRANSPOSE_4X4(in[33], in[37], in[41], in[45], out[18], out[22], out[26],
                out[30]);
  TRANSPOSE_4X4(in[48], in[52], in[56], in[60], out[3], out[7], out[11],
                out[15]);
  TRANSPOSE_4X4(in[49], in[53], in[57], in[61], out[19], out[23], out[27],
                out[31]);
  // Lower right 8x8
  TRANSPOSE_4X4(in[34], in[38], in[42], in[46], out[34], out[38], out[42],
                out[46]);
  TRANSPOSE_4X4(in[35], in[39], in[43], in[47], out[50], out[54], out[58],
                out[62]);
  TRANSPOSE_4X4(in[50], in[54], in[58], in[62], out[35], out[39], out[43],
                out[47]);
  TRANSPOSE_4X4(in[51], in[55], in[59], in[63], out[51], out[55], out[59],
                out[63]);
}